

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O3

int arkode_butcher_order5b
              (sunrealtype *b,sunrealtype *c1,sunrealtype *c2,sunrealtype **A,sunrealtype *c3,int s)

{
  int i;
  int iVar1;
  sunrealtype *b_00;
  void *__ptr;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  b_00 = (sunrealtype *)calloc((long)s,8);
  __ptr = calloc((long)s,8);
  if ((((0 < s) && (c1 != (sunrealtype *)0x0)) && (c2 != (sunrealtype *)0x0)) &&
     (b_00 != (sunrealtype *)0x0)) {
    uVar3 = (ulong)(uint)s;
    uVar2 = 0;
    do {
      b_00[uVar2] = c1[uVar2] * c2[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
    if (__ptr != (void *)0x0 && b != (sunrealtype *)0x0) {
      uVar2 = 0;
      do {
        *(double *)((long)__ptr + uVar2 * 8) = b[uVar2] * b_00[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
      iVar1 = arkode_butcher_mv(A,c3,s,b_00);
      if (iVar1 == 0) {
        dVar4 = 0.0;
        uVar2 = 0;
        do {
          dVar4 = dVar4 + b_00[uVar2] * *(double *)((long)__ptr + uVar2 * 8);
          uVar2 = uVar2 + 1;
        } while (uVar3 != uVar2);
        free(b_00);
        free(__ptr);
        return (uint)(ABS(dVar4 + -0.1) <= 1.4901161193847656e-08);
      }
    }
  }
  free(b_00);
  free(__ptr);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order5b(sunrealtype* b, sunrealtype* c1,
                                             sunrealtype* c2, sunrealtype** A,
                                             sunrealtype* c3, int s)
{
  sunrealtype bccAc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_vv(c1, c2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(b, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A, c3, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(tmp1, tmp2, s, &bccAc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bccAc - SUN_RCONST(0.1)) > TOL) ? SUNFALSE : SUNTRUE;
}